

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_parse_length.cpp
# Opt level: O0

int ON_ParseLengthExpression
              (wchar_t *str,int str_count,ON_ParseSettings parse_settings,
              LengthUnitSystem length_value_unit_system,double *length_value,
              ON_ParseSettings *parse_results,LengthUnitSystem *str_length_unit_system)

{
  ON__UINT16 OVar1;
  ON__UINT8 OVar2;
  ON__UINT8 OVar3;
  double dVar4;
  double s;
  double dStack_48;
  int parsed_element_count;
  double x;
  LengthUnitSystem *pLStack_38;
  LengthUnitSystem us;
  LengthUnitSystem *str_length_unit_system_local;
  ON_ParseSettings *parse_results_local;
  double *length_value_local;
  LengthUnitSystem length_value_unit_system_local;
  wchar_t *pwStack_18;
  int str_count_local;
  wchar_t *str_local;
  
  x._7_1_ = None;
  if (length_value_unit_system == CustomUnits) {
    if (str_length_unit_system != (LengthUnitSystem *)0x0) {
      *str_length_unit_system = None;
    }
    if (length_value != (double *)0x0) {
      *length_value = -1.23432101234321e+308;
    }
    if (parse_results != (ON_ParseSettings *)0x0) {
      *&parse_results->m_true_default_bits = ON_ParseSettings::FalseSettings.m_true_default_bits;
      *&parse_results->m_false_default_bits = ON_ParseSettings::FalseSettings.m_false_default_bits;
      OVar1 = ON_ParseSettings::FalseSettings.m_context_locale_id;
      OVar2 = ON_ParseSettings::FalseSettings.m_context_angle_unit_system;
      OVar3 = ON_ParseSettings::FalseSettings.m_context_length_unit_system;
      parse_results->m_reserved_bits = ON_ParseSettings::FalseSettings.m_reserved_bits;
      parse_results->m_context_locale_id = OVar1;
      parse_results->m_context_angle_unit_system = OVar2;
      parse_results->m_context_length_unit_system = OVar3;
      parse_results->m_reserved = ON_ParseSettings::FalseSettings.m_reserved;
    }
    str_local._4_4_ = 0;
  }
  else {
    dStack_48 = -1.23432101234321e+308;
    pLStack_38 = str_length_unit_system;
    str_length_unit_system_local = (LengthUnitSystem *)parse_results;
    parse_results_local = (ON_ParseSettings *)length_value;
    length_value_local._3_1_ = length_value_unit_system;
    length_value_local._4_4_ = str_count;
    pwStack_18 = str;
    str_local._4_4_ =
         ON_ParseLengthExpression
                   (str,str_count,parse_settings,&stack0xffffffffffffffb8,parse_results,
                    (LengthUnitSystem *)((long)&x + 7));
    if ((((0 < str_local._4_4_) && (x._7_1_ != length_value_local._3_1_)) &&
        (length_value_local._3_1_ != None)) && (x._7_1_ != None)) {
      dVar4 = ON::UnitScale(x._7_1_,length_value_local._3_1_);
      dStack_48 = dVar4 * dStack_48;
    }
    if (pLStack_38 != (LengthUnitSystem *)0x0) {
      *pLStack_38 = x._7_1_;
    }
    if (parse_results_local != (ON_ParseSettings *)0x0) {
      *(double *)parse_results_local->m_true_default_bits = dStack_48;
    }
  }
  return str_local._4_4_;
}

Assistant:

int ON_ParseLengthExpression( 
  const wchar_t* str,
  int str_count,
  ON_ParseSettings parse_settings,
  ON::LengthUnitSystem length_value_unit_system,
  double* length_value,
  ON_ParseSettings* parse_results,
  ON::LengthUnitSystem* str_length_unit_system
  )
{
  ON::LengthUnitSystem us = ON::LengthUnitSystem::None;

  if ( ON::LengthUnitSystem::CustomUnits == length_value_unit_system )
  {
    // must use the ON_UnitSystem override for custom units.
    if ( 0 != str_length_unit_system )
      *str_length_unit_system = us;
    if ( 0 != length_value )
      *length_value = ON_UNSET_VALUE;
    if ( 0 != parse_results )
      *parse_results = ON_ParseSettings::FalseSettings;
    return 0; 
  }
  
  double x = ON_UNSET_VALUE;
  int parsed_element_count = ON_ParseLengthExpression(
    str,
    str_count,
    parse_settings,
    &x,
    parse_results,
    &us
    );

  if ( parsed_element_count > 0 )
  {
    if (    us != length_value_unit_system 
         && ON::LengthUnitSystem::None != length_value_unit_system
         && ON::LengthUnitSystem::None != us
         )
    {
      double s = ON::UnitScale(us,length_value_unit_system);
      x *= s;
    }
  }

  if ( 0 != str_length_unit_system )
    *str_length_unit_system = us;
  if ( 0 != length_value )
    *length_value = x;

  return parsed_element_count;
}